

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O2

stbi_uc * stbi_load_gif_from_memory
                    (stbi_uc *buffer,int len,int **delays,int *x,int *y,int *z,int *comp,
                    int req_comp)

{
  int iVar1;
  int iVar2;
  stbi__context *__src;
  int *piVar3;
  int *piVar4;
  long lVar5;
  size_t __size;
  int iVar6;
  int iVar7;
  long lVar8;
  uchar *image;
  long *in_FS_OFFSET;
  uchar *local_89a8;
  size_t local_8998;
  stbi__context s;
  stbi__gif local_88a0;
  
  s.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  s.read_from_callbacks = 0;
  s.img_buffer_end = buffer + len;
  piVar4 = y;
  s.img_buffer = buffer;
  s.img_buffer_original = buffer;
  s.img_buffer_original_end = s.img_buffer_end;
  iVar2 = stbi__gif_test(&s);
  if (iVar2 == 0) {
    in_FS_OFFSET[-2] = (long)"not GIF";
    local_89a8 = (uchar *)0x0;
  }
  else {
    memset(&local_88a0,0,0x8870);
    if (delays != (int **)0x0) {
      *delays = (int *)0x0;
    }
    local_8998 = 4;
    lVar5 = 0;
    local_89a8 = (uchar *)0x0;
    lVar8 = 0;
    while( true ) {
      __src = (stbi__context *)stbi__gif_load_next(&s,&local_88a0,comp,(int)lVar8,(stbi_uc *)piVar4)
      ;
      iVar2 = (int)lVar5;
      if ((__src == &s) || (__src == (stbi__context *)0x0)) break;
      *x = local_88a0.w;
      *y = local_88a0.h;
      iVar6 = local_88a0.h * local_88a0.w;
      iVar1 = iVar6 * 4;
      __size = (size_t)((iVar2 + 1) * iVar1);
      if (local_89a8 == (uchar *)0x0) {
        local_89a8 = (uchar *)malloc(__size);
        if (delays != (int **)0x0) {
          piVar3 = (int *)malloc(local_8998);
LAB_001385b9:
          *delays = piVar3;
        }
      }
      else {
        local_89a8 = (uchar *)realloc(local_89a8,__size);
        if (local_89a8 == (uchar *)0x0) {
          free(local_88a0.out);
          free(local_88a0.history);
          free(local_88a0.background);
          in_FS_OFFSET[-2] = (long)"outofmem";
          local_89a8 = (uchar *)0x0;
          goto LAB_001386d6;
        }
        if (delays != (int **)0x0) {
          piVar3 = (int *)realloc(*delays,local_8998);
          goto LAB_001385b9;
        }
      }
      memcpy(local_89a8 + iVar2 * iVar1,__src,(long)iVar1);
      if (lVar5 != 0) {
        lVar8 = (long)local_89a8 - (long)(iVar6 * 8);
      }
      if (delays != (int **)0x0) {
        (*delays)[lVar5] = local_88a0.delay;
      }
      local_8998 = local_8998 + 4;
      lVar5 = lVar5 + 1;
    }
    free(local_88a0.out);
    free(local_88a0.history);
    free(local_88a0.background);
    if ((req_comp & 0xfffffffbU) != 0) {
      local_89a8 = stbi__convert_format(local_89a8,4,req_comp,local_88a0.w * iVar2,local_88a0.h);
    }
    *z = iVar2;
  }
LAB_001386d6:
  piVar4 = &stbi__vertically_flip_on_load_global;
  if (*(int *)((long)in_FS_OFFSET + -4) != 0) {
    piVar4 = (int *)(*in_FS_OFFSET + -8);
  }
  if (*piVar4 != 0) {
    iVar2 = *x;
    iVar1 = *y;
    iVar6 = *comp;
    image = local_89a8;
    iVar7 = 0;
    if (0 < *z) {
      iVar7 = *z;
    }
    while (iVar7 != 0) {
      stbi__vertical_flip(image,iVar2,iVar1,iVar6);
      image = image + iVar1 * iVar2 * iVar6;
      iVar7 = iVar7 + -1;
    }
  }
  return local_89a8;
}

Assistant:

STBIDEF stbi_uc *stbi_load_gif_from_memory(stbi_uc const *buffer, int len, int **delays, int *x, int *y, int *z, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s;
   stbi__start_mem(&s,buffer,len);

   result = (unsigned char*) stbi__load_gif_main(&s, delays, x, y, z, comp, req_comp);
   if (stbi__vertically_flip_on_load) {
      stbi__vertical_flip_slices( result, *x, *y, *z, *comp );
   }

   return result;
}